

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

size_t parse_uric(char *in,size_t max,token *out)

{
  int iVar1;
  bool bVar2;
  ulong local_28;
  size_t i;
  token *out_local;
  size_t max_local;
  char *in_local;
  
  local_28 = 0;
  while( true ) {
    bVar2 = false;
    if (local_28 < max) {
      iVar1 = is_unreserved(in[local_28]);
      bVar2 = true;
      if (iVar1 == 0) {
        iVar1 = is_reserved(in[local_28]);
        bVar2 = true;
        if ((iVar1 == 0) && (bVar2 = false, local_28 + 2 < max)) {
          iVar1 = is_escaped(in + local_28);
          bVar2 = iVar1 != 0;
        }
      }
    }
    if (!bVar2) break;
    local_28 = local_28 + 1;
  }
  out->size = local_28;
  out->buff = in;
  return local_28;
}

Assistant:

static size_t parse_uric(
	/*! [in] String of characters. */
	const char *in,
	/*! [in] Maximum limit. */
	size_t max,
	/*! [out] Token object where the string of characters is copied. */
	token *out)
{
	size_t i = (size_t)0;

	while (i < max &&
		(is_unreserved(in[i]) || is_reserved(in[i]) ||
			((i + (size_t)2 < max) && is_escaped(&in[i])))) {
		i++;
	}

	out->size = i;
	out->buff = in;
	return i;
}